

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O3

void __thiscall QtMWidgets::Slider::mousePressEvent(Slider *this,QMouseEvent *e)

{
  SliderPrivate *this_00;
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  SliderAction SVar5;
  double dVar6;
  double in_XMM1_Qa;
  QRect hr;
  undefined8 local_38;
  QRect local_30;
  
  iVar2 = QAbstractSlider::maximum();
  iVar3 = QAbstractSlider::minimum();
  if (((iVar2 == iVar3) || (*(int *)(e + 0x44) != *(int *)(e + 0x40))) || (*(int *)(e + 0x44) != 1))
  {
    e[0xc] = (QMouseEvent)0x0;
    return;
  }
  e[0xc] = (QMouseEvent)0x1;
  local_30 = SliderPrivate::handleRect((this->d).d);
  dVar6 = (double)QEventPoint::position();
  local_38 = CONCAT44((int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                           in_XMM1_Qa),
                      (int)((double)((ulong)dVar6 & 0x8000000000000000 | 0x3fe0000000000000) + dVar6
                           ));
  cVar1 = QRect::contains((QPoint *)&local_30,SUB81(&local_38,0));
  this_00 = (this->d).d;
  SVar5 = (SliderAction)this;
  if (cVar1 == '\0') {
    this_00->pressedControl = SC_ComboBoxFrame;
    dVar6 = (double)QEventPoint::position();
    iVar2 = QAbstractSlider::orientation();
    if (iVar2 != 1) {
      dVar6 = in_XMM1_Qa;
    }
    in_XMM1_Qa = dVar6;
    iVar2 = SliderPrivate::pixelPosToRangeValue
                      (this_00,(int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 |
                                             (ulong)DAT_00180820) + in_XMM1_Qa) +
                               ((this->d).d)->radius * -2);
    iVar3 = QAbstractSlider::value();
    iVar4 = 3;
    if (iVar2 <= iVar3) {
      iVar3 = QAbstractSlider::value();
      iVar4 = 4;
      if (iVar3 <= iVar2) goto LAB_0017a52a;
    }
    QAbstractSlider::triggerAction(SVar5);
    QAbstractSlider::setRepeatAction(SVar5,iVar4,500);
  }
  else {
    this_00->pressedControl = SC_ComboBoxEditField;
    QAbstractSlider::setRepeatAction(SVar5,0,500);
    QAbstractSlider::triggerAction(SVar5);
    QWidget::update();
  }
LAB_0017a52a:
  if (((this->d).d)->pressedControl == SC_ComboBoxEditField) {
    dVar6 = (double)QEventPoint::position();
    iVar3 = local_30.x1;
    iVar2 = local_30.y1;
    iVar4 = QAbstractSlider::orientation();
    iVar2 = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) + in_XMM1_Qa
                 ) - iVar2;
    if (iVar4 == 1) {
      iVar2 = (int)((double)((ulong)dVar6 & 0x8000000000000000 | 0x3fe0000000000000) + dVar6) -
              iVar3;
    }
    ((this->d).d)->clickOffset = iVar2;
    QAbstractSlider::setRepeatAction(SVar5,0,500);
    QAbstractSlider::setSliderDown(SUB81(this,0));
  }
  return;
}

Assistant:

void
Slider::mousePressEvent( QMouseEvent * e )
{
	if( maximum() == minimum() || ( e->buttons() ^ e->button() ) )
	{
		e->ignore();
		return;
	}

	if( e->button() == Qt::LeftButton )
	{
		e->accept();
		const QRect hr = d->handleRect();

		if( hr.contains( e->pos() ) )
		{
			d->pressedControl = QStyle::SC_SliderHandle;
			setRepeatAction( SliderNoAction );
			triggerAction( SliderMove );
			update();
		}
		else
		{
			d->pressedControl = QStyle::SC_SliderGroove;
			SliderAction action = SliderNoAction;

			const int pressValue =
				d->pixelPosToRangeValue( d->pick( e->pos() ) - 2 * d->radius );

			if( pressValue > value() )
				action = SliderPageStepAdd;
			else if( pressValue < value() )
				action = SliderPageStepSub;
			if( action )
			{
				triggerAction( action );
				setRepeatAction( action );
			}
		}

		if( d->pressedControl == QStyle::SC_SliderHandle )
		{
			d->clickOffset = d->pick( e->pos() - hr.topLeft() );
			setRepeatAction( SliderNoAction );
			setSliderDown( true );
		}
	}
	else
		e->ignore();
}